

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Classifer __thiscall CLI::App::_recognize(App *this,string *current)

{
  bool bVar1;
  undefined1 local_60 [8];
  string dummy2;
  string dummy1;
  string *current_local;
  App *this_local;
  
  ::std::__cxx11::string::string((string *)(dummy2.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)local_60);
  bVar1 = ::std::operator==(current,"--");
  if (bVar1) {
    this_local._4_4_ = POSITIONAL_MARK;
  }
  else {
    bVar1 = _valid_subcommand(this,current);
    if (bVar1) {
      this_local._4_4_ = SUBCOMMAND;
    }
    else {
      bVar1 = detail::split_long(current,(string *)((long)&dummy2.field_2 + 8),(string *)local_60);
      if (bVar1) {
        this_local._4_4_ = LONG;
      }
      else {
        bVar1 = detail::split_short(current,(string *)((long)&dummy2.field_2 + 8),(string *)local_60
                                   );
        if (bVar1) {
          this_local._4_4_ = SHORT;
        }
        else {
          this_local._4_4_ = NONE;
        }
      }
    }
  }
  ::std::__cxx11::string::~string((string *)local_60);
  ::std::__cxx11::string::~string((string *)(dummy2.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

detail::Classifer _recognize(const std::string &current) const {
        std::string dummy1, dummy2;

        if(current == "--")
            return detail::Classifer::POSITIONAL_MARK;
        if(_valid_subcommand(current))
            return detail::Classifer::SUBCOMMAND;
        if(detail::split_long(current, dummy1, dummy2))
            return detail::Classifer::LONG;
        if(detail::split_short(current, dummy1, dummy2))
            return detail::Classifer::SHORT;
        return detail::Classifer::NONE;
    }